

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall xemmai::t_emit::f_merge(t_emit *this,t_block *a_junction)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference local_30;
  ulong local_20;
  size_t i;
  t_block *a_junction_local;
  t_emit *this_local;
  
  local_20 = 0;
  i = (size_t)a_junction;
  a_junction_local = (t_block *)this;
  while( true ) {
    uVar2 = local_20;
    sVar3 = std::
            vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
            ::size((vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                    *)(i + 0x10));
    if (sVar3 <= uVar2) break;
    pvVar4 = std::
             vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
             ::operator[]((vector<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                           *)(i + 0x10),local_20);
    bVar1 = pvVar4->v_out;
    local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](this->v_privates,local_20);
    std::_Bit_reference::operator=(&local_30,(bool)(bVar1 & 1));
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void f_merge(const ast::t_block& a_junction)
	{
		for (size_t i = 0; i < a_junction.v_privates.size(); ++i) (*v_privates)[i] = a_junction.v_privates[i].v_out;
	}